

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_12x12(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_114;
  int *local_108;
  int *local_100;
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [8];
  int local_98 [7];
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  int *local_8;
  
  local_114 = 0;
  local_100 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      pbVar3 = (byte *)(*(long *)(local_10 + (long)local_114 * 8) + (ulong)local_14);
      local_50 = (long)(int)((uint)*pbVar3 + (uint)pbVar3[0xb]) +
                 (long)(int)((uint)pbVar3[5] + (uint)pbVar3[6]);
      dataptr = (DCTELEM *)
                ((long)(int)((uint)*pbVar3 + (uint)pbVar3[0xb]) -
                (long)(int)((uint)pbVar3[5] + (uint)pbVar3[6]));
      wsptr = (DCTELEM *)
              ((long)(int)((uint)pbVar3[1] + (uint)pbVar3[10]) -
              (long)(int)((uint)pbVar3[4] + (uint)pbVar3[7]));
      local_60 = (long)(int)((uint)pbVar3[2] + (uint)pbVar3[9]) +
                 (long)(int)((uint)pbVar3[3] + (uint)pbVar3[8]);
      elemptr = (JSAMPROW)
                ((long)(int)((uint)pbVar3[2] + (uint)pbVar3[9]) -
                (long)(int)((uint)pbVar3[3] + (uint)pbVar3[8]));
      local_20 = (long)(int)((uint)*pbVar3 - (uint)pbVar3[0xb]);
      local_28 = (long)(int)((uint)pbVar3[1] - (uint)pbVar3[10]);
      local_30 = (long)(int)((uint)pbVar3[2] - (uint)pbVar3[9]);
      local_38 = (long)(int)((uint)pbVar3[3] - (uint)pbVar3[8]);
      local_40 = (long)(int)((uint)pbVar3[4] - (uint)pbVar3[7]);
      local_48 = (long)(int)((uint)pbVar3[5] - (uint)pbVar3[6]);
      *local_100 = (int)local_50 +
                   (uint)pbVar3[1] + (uint)pbVar3[10] + (uint)pbVar3[4] + (uint)pbVar3[7] +
                   (int)local_60 + -0x600;
      local_100[6] = ((int)dataptr - (int)wsptr) - (int)elemptr;
      local_100[4] = (int)((local_50 - local_60) * 0x2731 + 0x1000 >> 0xd);
      local_100[2] = (int)((long)wsptr + (long)dataptr * 0x2bb6 + (long)elemptr * 0x2bb5 + 0x1000 >>
                          0xd);
      lVar4 = (local_28 + local_40) * 0x1151;
      lVar5 = lVar4 + local_28 * 0x187e;
      lVar4 = lVar4 + local_40 * -0x3b21;
      lVar6 = (local_20 + local_30) * 0x23e7;
      lVar7 = (local_20 + local_38) * 0x1b8d;
      lVar8 = (local_30 + local_38) * -0x5e8;
      local_60 = (lVar8 - lVar4) + local_30 * -0x4add + local_48 * 0x1b8d + lVar6;
      dataptr = (DCTELEM *)((lVar8 - lVar5) + local_38 * 0x173a + local_48 * -0x23e7 + lVar7);
      local_58 = lVar4 + (local_20 - local_38) * 0x29cf + (local_30 + local_48) * -0x1151;
      local_100[1] = (int)(lVar6 + lVar7 + lVar5 + local_20 * -0x1296 + local_48 * 0x5e8 + 0x1000 >>
                          0xd);
      local_100[3] = (int)(local_58 + 0x1000 >> 0xd);
      local_100[5] = (int)(local_60 + 0x1000 >> 0xd);
      local_100[7] = (int)((long)(dataptr + 0x400) >> 0xd);
      local_114 = local_114 + 1;
      if (local_114 != 8) break;
      local_100 = local_f8;
    }
    if (local_114 == 0xc) break;
    local_100 = local_100 + 8;
  }
  local_100 = local_8;
  local_108 = local_f8;
  for (local_114 = 7; -1 < local_114; local_114 = local_114 + -1) {
    lVar5 = (long)(*local_100 + local_108[0x18]) + (long)(local_100[0x28] + local_100[0x30]);
    lVar4 = (long)(*local_100 + local_108[0x18]) - (long)(local_100[0x28] + local_100[0x30]);
    lVar6 = (long)(local_100[8] + local_108[0x10]) - (long)(local_100[0x20] + local_100[0x38]);
    lVar7 = (long)(local_100[0x10] + local_108[8]) + (long)(local_100[0x18] + *local_108);
    lVar8 = (long)(local_100[0x10] + local_108[8]) - (long)(local_100[0x18] + *local_108);
    lVar9 = (long)(*local_100 - local_108[0x18]);
    iVar1 = local_108[0x10];
    lVar10 = (long)(local_100[0x10] - local_108[8]);
    lVar11 = (long)(local_100[0x18] - *local_108);
    iVar2 = local_100[0x20];
    lVar12 = (long)(local_100[0x28] - local_100[0x30]);
    *local_100 = (int)((lVar5 + (long)(local_100[8] + local_108[0x10]) +
                                (long)(local_100[0x20] + local_100[0x38]) + lVar7) * 0x1c72 + 0x2000
                      >> 0xe);
    local_100[0x30] = (int)(((lVar4 - lVar6) - lVar8) * 0x1c72 + 0x2000 >> 0xe);
    local_100[0x20] = (int)((lVar5 - lVar7) * 0x22d6 + 0x2000 >> 0xe);
    local_100[0x10] = (int)((lVar6 - lVar8) * 0x1c72 + (lVar4 + lVar8) * 0x26db + 0x2000 >> 0xe);
    lVar4 = ((long)(local_100[8] - iVar1) + (long)(iVar2 - local_100[0x38])) * 0xf65;
    lVar5 = lVar4 + (long)(local_100[8] - iVar1) * 0x15c5;
    lVar4 = lVar4 + (long)(iVar2 - local_100[0x38]) * -0x348f;
    lVar6 = (lVar9 + lVar10) * 0x1fea;
    lVar7 = (lVar9 + lVar11) * 0x187d;
    lVar8 = (lVar10 + lVar11) * -0x540;
    local_100[8] = (int)(lVar6 + lVar7 + lVar5 + lVar9 * -0x1085 + lVar12 * 0x540 + 0x2000 >> 0xe);
    local_100[0x18] =
         (int)(lVar4 + (lVar9 - lVar11) * 0x252a + (lVar10 + lVar12) * -0xf65 + 0x2000 >> 0xe);
    local_100[0x28] =
         (int)((lVar8 - lVar4) + lVar10 * -0x428c + lVar12 * 0x187d + lVar6 + 0x2000 >> 0xe);
    local_100[0x38] =
         (int)((lVar8 - lVar5) + lVar11 * 0x14a5 + lVar12 * -0x1fea + lVar7 + 0x2000 >> 0xe);
    local_100 = local_100 + 1;
    local_108 = local_108 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x12 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM workspace[8*4];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) (tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE);
    dataptr[6] = (DCTELEM) (tmp13 - tmp14 - tmp15);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 12)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/12)**2 = 4/9, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/24) * 8/9.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*6];

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(MULTIPLY(tmp13 - tmp14 - tmp15, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.088662108)),         /* c4 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp14 - tmp15, FIX(0.888888889)) +        /* 8/9 */
	      MULTIPLY(tmp13 + tmp15, FIX(1.214244803)),         /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX(0.481063200));   /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX(0.680326102));  /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX(1.642452502));  /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(0.997307603));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.765261039));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.516244403)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.164081699));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.164081699)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.079550144)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.765261039));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.645144899)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(0.997307603));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.161389302)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX(0.481063200)); /* c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}